

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleHashCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  ostream *poVar2;
  string out;
  ostringstream e;
  string local_1d8;
  string local_1b8;
  ostream local_198;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    cmCryptoHash::New((cmCryptoHash *)&local_198,(pbVar1->_M_dataplus)._M_p);
    if ((cmCryptoHash *)local_198._vptr_basic_ostream != (cmCryptoHash *)0x0) {
      cmCryptoHash::HashFile
                (&local_1d8,(cmCryptoHash *)local_198._vptr_basic_ostream,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
      if (local_1d8._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
        poVar2 = std::operator<<(&local_198,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar2 = std::operator<<(poVar2," failed to read file \"");
        poVar2 = std::operator<<(poVar2,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        poVar2 = std::operator<<(poVar2,"\": ");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::operator<<(poVar2,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      }
      else {
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 2,local_1d8._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_1d8);
      (*(*(_func_int ***)local_198._vptr_basic_ostream)[1])(local_198._vptr_basic_ostream);
      return local_1d8._M_string_length != 0;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    poVar2 = std::operator<<(&local_198,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar2," requires a file name and output variable");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  }
  return false;
}

Assistant:

bool cmFileCommand::HandleHashCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if(args.size() != 3)
    {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
    }

  cmsys::auto_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0].c_str()));
  if(hash.get())
    {
    std::string out = hash->HashFile(args[1]);
    if(!out.empty())
      {
      this->Makefile->AddDefinition(args[2], out.c_str());
      return true;
      }
    std::ostringstream e;
    e << args[0] << " failed to read file \"" << args[1] << "\": "
      << cmSystemTools::GetLastSystemError();
    this->SetError(e.str());
    }
  return false;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}